

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb_arith_encode(stb_arith *a,uint totalfreq,uint freq,uint cumfreq)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = a->range_low;
  uVar1 = (a->range_high - uVar5) / totalfreq;
  uVar3 = cumfreq * uVar1;
  uVar4 = uVar3 + uVar5;
  a->range_low = uVar4;
  a->range_high = uVar4 + freq * uVar1;
  if (CARRY4(uVar3,uVar5)) {
    stb__arith_carry(a);
  }
  uVar5 = a->range_low;
  for (uVar1 = a->range_high - uVar5; uVar1 < 0x1000000; uVar1 = iVar2 + uVar1 * -0x100) {
    stb__arith_putbyte(a,uVar5 >> 0x18);
    uVar1 = a->range_low;
    uVar5 = uVar1 * 0x100;
    a->range_low = uVar5;
    iVar2 = a->range_high * 0x100;
    a->range_high = iVar2 + 0xff;
  }
  return;
}

Assistant:

void stb_arith_encode(stb_arith *a, unsigned int totalfreq, unsigned int freq, unsigned int cumfreq)
{
   unsigned int range = a->range_high - a->range_low;
   unsigned int old = a->range_low;
   range /= totalfreq;
   a->range_low += range * cumfreq;
   a->range_high = a->range_low + range*freq;
   if (a->range_low < old)
      stb__arith_carry(a);
   while (a->range_high - a->range_low < 0x1000000)
      stb__renorm_encoder(a);
}